

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

void __thiscall
amrex::ParmParse::getarr
          (ParmParse *this,char *name,vector<int,_std::allocator<int>_> *ptr,int start_ix,
          int num_val)

{
  Table *table;
  allocator local_71;
  string local_70;
  string local_50;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_50,name,&local_71);
  prefixedName(&local_70,this,&local_50);
  anon_unknown_12::anon_unknown_0::sgetarr<int>(table,&local_70,ptr,start_ix,num_val,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ParmParse::getarr (const char* name,
                   std::vector<int>& ptr,
                   int         start_ix,
                   int         num_val) const
{
    sgetarr(m_table, prefixedName(name),ptr,start_ix,num_val, LAST);
}